

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void __thiscall CentralBroker::~CentralBroker(CentralBroker *this)

{
  if (this->initialized == true) {
    zactor_destroy(&this->logger);
  }
  if (this->brokerHandle != (BrokerClient *)0x0) {
    (*(this->brokerHandle->super_MlmWrap)._vptr_MlmWrap[1])();
  }
  zactor_destroy(&this->broker);
  zsys_shutdown();
  std::__cxx11::string::~string((string *)&this->address);
  std::__cxx11::string::~string((string *)&this->endpoint);
  return;
}

Assistant:

CentralBroker::~CentralBroker() {
    if(initialized){
        zactor_destroy(&logger);
    }
    delete brokerHandle;
    zactor_destroy(&broker);
    zsys_shutdown();
}